

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O0

InplaceStr
GetFunctionNameInScope
          (ExpressionContext *ctx,ScopeData *scope,TypeBase *parentType,InplaceStr str,
          bool isOperator,bool isAccessor)

{
  InplaceStr IVar1;
  bool bVar2;
  undefined1 __src [8];
  ExpressionContext *pEVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  char *pcVar8;
  size_t sVar9;
  ScopeData *strBegin;
  undefined1 *puVar10;
  undefined1 local_88 [8];
  InplaceStr nsName;
  ScopeData *curr_1;
  char *pos;
  char *name;
  ScopeData *curr;
  uint nameLength;
  bool foundNamespace;
  char *name_1;
  uint nameLength_1;
  bool isAccessor_local;
  bool isOperator_local;
  TypeBase *parentType_local;
  ScopeData *scope_local;
  ExpressionContext *ctx_local;
  InplaceStr str_local;
  char *local_10;
  char *pcVar7;
  undefined4 extraout_var_00;
  
  str_local.begin = str.end;
  ctx_local = (ExpressionContext *)str.begin;
  if (parentType == (TypeBase *)0x0) {
    pEVar3 = ctx_local;
    pcVar7 = str_local.begin;
    if (!isOperator) {
      if (((isAccessor ^ 0xffU) & 1) == 0) {
        __assert_fail("!isAccessor",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                      ,0x256,
                      "InplaceStr GetFunctionNameInScope(ExpressionContext &, ScopeData *, TypeBase *, InplaceStr, bool, bool)"
                     );
      }
      bVar2 = false;
      curr._0_4_ = InplaceStr::length((InplaceStr *)&ctx_local);
      for (name = (char *)scope; name != (char *)0x0; name = *(char **)name) {
        if (*(int *)(name + 0xc) == 5) {
          str_local.end = (char *)ctx_local;
          local_10 = str_local.begin;
          pEVar3 = (ExpressionContext *)str_local.end;
          pcVar7 = local_10;
          goto LAB_0028aec2;
        }
        if ((*(long *)(name + 0x18) != 0) && (!bVar2)) {
          str_local.end = (char *)ctx_local;
          local_10 = str_local.begin;
          pEVar3 = (ExpressionContext *)str_local.end;
          pcVar7 = local_10;
          goto LAB_0028aec2;
        }
        if ((*(long *)(name + 0x20) != 0) && (!bVar2)) {
          __assert_fail("foundNamespace",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                        ,0x267,
                        "InplaceStr GetFunctionNameInScope(ExpressionContext &, ScopeData *, TypeBase *, InplaceStr, bool, bool)"
                       );
        }
        if (*(long *)(name + 0x10) != 0) {
          uVar4 = InplaceStr::length((InplaceStr *)(*(long *)(name + 0x10) + 0x80));
          curr._0_4_ = uVar4 + 1 + (uint)curr;
          bVar2 = true;
        }
      }
      if (bVar2) {
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)((uint)curr + 1));
        strBegin = (ScopeData *)CONCAT44(extraout_var_00,iVar6);
        puVar10 = (undefined1 *)((long)(strBegin->types).little + ((ulong)((uint)curr + 1) - 0x59));
        *puVar10 = 0;
        uVar4 = InplaceStr::length((InplaceStr *)&ctx_local);
        pEVar3 = ctx_local;
        curr_1 = (ScopeData *)(puVar10 + -(ulong)uVar4);
        uVar4 = InplaceStr::length((InplaceStr *)&ctx_local);
        memcpy(curr_1,pEVar3,(ulong)uVar4);
        for (nsName.end = (char *)scope; nsName.end != (char *)0x0;
            nsName.end = *(char **)nsName.end) {
          if (*(long *)(nsName.end + 0x10) != 0) {
            local_88 = *(undefined1 (*) [8])(*(long *)(nsName.end + 0x10) + 0x80);
            nsName.begin = *(char **)(*(long *)(nsName.end + 0x10) + 0x88);
            puVar10 = (undefined1 *)((long)&curr_1[-1].allVariables.allocator + 7);
            *puVar10 = 0x2e;
            uVar4 = InplaceStr::length((InplaceStr *)local_88);
            __src = local_88;
            curr_1 = (ScopeData *)(puVar10 + -(ulong)uVar4);
            uVar4 = InplaceStr::length((InplaceStr *)local_88);
            memcpy(curr_1,(void *)__src,(ulong)uVar4);
          }
        }
        if (curr_1 != strBegin) {
          __assert_fail("pos == name",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                        ,0x28f,
                        "InplaceStr GetFunctionNameInScope(ExpressionContext &, ScopeData *, TypeBase *, InplaceStr, bool, bool)"
                       );
        }
        InplaceStr::InplaceStr((InplaceStr *)&str_local.end,(char *)strBegin);
        pEVar3 = (ExpressionContext *)str_local.end;
        pcVar7 = local_10;
      }
      else {
        str_local.end = (char *)ctx_local;
        local_10 = str_local.begin;
        pEVar3 = (ExpressionContext *)str_local.end;
        pcVar7 = local_10;
      }
    }
  }
  else {
    uVar4 = InplaceStr::length(&parentType->name);
    uVar5 = InplaceStr::length((InplaceStr *)&ctx_local);
    uVar4 = uVar4 + uVar5 + (uint)isAccessor + 3;
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)uVar4);
    pcVar7 = (char *)CONCAT44(extraout_var,iVar6);
    pcVar8 = "";
    if (isAccessor) {
      pcVar8 = "$";
    }
    NULLC::SafeSprintf(pcVar7,(ulong)uVar4,"%.*s::%.*s%s",
                       (ulong)(uint)((int)(parentType->name).end - (int)(parentType->name).begin),
                       (parentType->name).begin,(ulong)(uint)((int)str_local.begin - (int)ctx_local)
                       ,ctx_local,pcVar8);
    sVar9 = strlen(pcVar7);
    if (sVar9 + 1 != (ulong)uVar4) {
      __assert_fail("strlen(name) + 1 == nameLength",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                    ,0x24f,
                    "InplaceStr GetFunctionNameInScope(ExpressionContext &, ScopeData *, TypeBase *, InplaceStr, bool, bool)"
                   );
    }
    InplaceStr::InplaceStr((InplaceStr *)&str_local.end,pcVar7);
    pEVar3 = (ExpressionContext *)str_local.end;
    pcVar7 = local_10;
  }
LAB_0028aec2:
  local_10 = pcVar7;
  str_local.end = (char *)pEVar3;
  IVar1.end = local_10;
  IVar1.begin = str_local.end;
  return IVar1;
}

Assistant:

InplaceStr GetFunctionNameInScope(ExpressionContext &ctx, ScopeData *scope, TypeBase *parentType, InplaceStr str, bool isOperator, bool isAccessor)
{
	if(parentType)
	{
		unsigned nameLength = parentType->name.length() + 2 + str.length() + (isAccessor ? 1 : 0) + 1;
		char *name = (char*)ctx.allocator->alloc(nameLength);

		NULLC::SafeSprintf(name, nameLength, "%.*s::%.*s%s", FMT_ISTR(parentType->name), FMT_ISTR(str), isAccessor ? "$" : "");

		assert(strlen(name) + 1 == nameLength);
		return InplaceStr(name);
	}

	if(isOperator)
		return str;

	assert(!isAccessor);

	bool foundNamespace = false;

	unsigned nameLength = str.length();

	for(ScopeData *curr = scope; curr; curr = curr->scope)
	{
		// Temporary scope is not evaluated
		if(curr->type == SCOPE_TEMPORARY)
			return str;

		// Function scope, just use the name
		if(curr->ownerFunction && !foundNamespace)
			return str;

		if(curr->ownerType)
			assert(foundNamespace);

		if(curr->ownerNamespace)
		{
			nameLength += curr->ownerNamespace->name.name.length() + 1;

			foundNamespace = true;
		}
	}

	nameLength += 1;

	if(!foundNamespace)
		return str;

	char *name = (char*)ctx.allocator->alloc(nameLength);

	// Format a string back-to-front
	char *pos = name + nameLength;

	pos -= 1;
	*pos = 0;

	pos -= str.length();
	memcpy(pos, str.begin, str.length());

	for(ScopeData *curr = scope; curr; curr = curr->scope)
	{
		if(curr->ownerNamespace)
		{
			InplaceStr nsName = curr->ownerNamespace->name.name;

			pos -= 1;
			*pos = '.';

			pos -= nsName.length();
			memcpy(pos, nsName.begin, nsName.length());
		}
	}

	assert(pos == name);

	return InplaceStr(name);
}